

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScene::drawItems
          (QGraphicsScene *this,QPainter *painter,int numItems,QGraphicsItem **items,
          QStyleOptionGraphicsItem *options,QWidget *widget)

{
  undefined1 *puVar1;
  ulong *puVar2;
  QGraphicsScenePrivate *this_00;
  double dVar3;
  qreal *pqVar4;
  QGraphicsView *pQVar5;
  QGraphicsItem *t;
  long lVar6;
  QTransform *pQVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  byte bVar10;
  quint32 local_cc;
  quint32 *local_c8;
  QRegion *local_c0;
  QArrayDataPointer<QGraphicsItem_*> local_a8;
  QTransform local_88;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  if ((this_00->unpolishedItems).d.size != 0) {
    QGraphicsScenePrivate::_q_polishItems(this_00);
  }
  dVar3 = (double)QPainter::opacity();
  pqVar4 = (qreal *)QPainter::worldTransform();
  pQVar7 = &local_88;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pQVar7->m_matrix[0][0] = *pqVar4;
    pqVar4 = pqVar4 + (ulong)bVar10 * -2 + 1;
    pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  if (widget == (QWidget *)0x0) {
    local_cc = this_00->rectAdjust;
  }
  else {
    pQVar5 = QtPrivate::qobject_cast_helper<QGraphicsView*,QObject>
                       (*(QObject **)(*(long *)&widget->field_0x8 + 0x10));
    local_cc = this_00->rectAdjust;
    if (pQVar5 != (QGraphicsView *)0x0) {
      this_00->field_0xb8 = this_00->field_0xb8 & 0xfb;
      lVar6 = *(long *)&(pQVar5->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
      local_c0 = (QRegion *)(lVar6 + 0x548);
      if ((*(byte *)(lVar6 + 0x488) & 2) == 0) {
        this_00->rectAdjust = 2;
      }
      else {
        this_00->rectAdjust = 1;
      }
      goto LAB_0059eb36;
    }
  }
  local_c0 = (QRegion *)0x0;
LAB_0059eb36:
  local_c8 = &this_00->rectAdjust;
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (QGraphicsItem **)0x0;
  uVar9 = 0;
  uVar8 = (ulong)(uint)numItems;
  if (numItems < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    t = QGraphicsItem::topLevelItem(items[uVar9]);
    if ((((t->d_ptr).d)->field_0x161 & 0x40) == 0) {
      QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)&local_a8,t);
      puVar1 = &((t->d_ptr).d)->field_0x160;
      *(ulong *)puVar1 = *(ulong *)puVar1 | 0x4000;
      QGraphicsScenePrivate::drawSubtreeRecursive
                (this_00,t,painter,&local_88,local_c0,widget,1.0,(QTransform *)0x0);
    }
  }
  *local_c8 = local_cc;
  for (lVar6 = 0; local_a8.size << 3 != lVar6; lVar6 = lVar6 + 8) {
    puVar2 = (ulong *)(*(long *)(*(long *)((long)local_a8.ptr + lVar6) + 8) + 0x160);
    *puVar2 = *puVar2 & 0xffffffffffffbfff;
  }
  QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_88,0));
  QPainter::setOpacity(dVar3);
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::drawItems(QPainter *painter,
                               int numItems,
                               QGraphicsItem *items[],
                               const QStyleOptionGraphicsItem options[], QWidget *widget)
{
    Q_D(QGraphicsScene);
    // Make sure we don't have unpolished items before we draw.
    if (!d->unpolishedItems.isEmpty())
        d->_q_polishItems();

    const qreal opacity = painter->opacity();
    QTransform viewTransform = painter->worldTransform();
    Q_UNUSED(options);

    // Determine view, expose and flags.
    QGraphicsView *view = widget ? qobject_cast<QGraphicsView *>(widget->parentWidget()) : 0;
    QRegion *expose = nullptr;
    const quint32 oldRectAdjust = d->rectAdjust;
    if (view) {
        d->updateAll = false;
        expose = &view->d_func()->exposedRegion;
        if (view->d_func()->optimizationFlags & QGraphicsView::DontAdjustForAntialiasing)
            d->rectAdjust = 1;
        else
            d->rectAdjust = 2;
    }

    // Find all toplevels, they are already sorted.
    QList<QGraphicsItem *> topLevelItems;
    for (int i = 0; i < numItems; ++i) {
        QGraphicsItem *item = items[i]->topLevelItem();
        if (!item->d_ptr->itemDiscovered) {
            topLevelItems << item;
            item->d_ptr->itemDiscovered = 1;
            d->drawSubtreeRecursive(item, painter, &viewTransform, expose, widget);
        }
    }

    d->rectAdjust = oldRectAdjust;
    // Reset discovery bits.
    for (auto topLevelItem : std::as_const(topLevelItems))
        topLevelItem->d_ptr->itemDiscovered = 0;

    painter->setWorldTransform(viewTransform);
    painter->setOpacity(opacity);
}